

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCacheCoverage.cxx
# Opt level: O1

void __thiscall cmParseCacheCoverage::RemoveUnCoveredFiles(cmParseCacheCoverage *this)

{
  cmCTestCoverageHandlerContainer *pcVar1;
  cmCTest *this_00;
  _Base_ptr p_Var2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  undefined1 *puVar5;
  bool bVar6;
  _Self __tmp;
  const_iterator __position;
  ostringstream cmCTestLog_msg;
  long *local_1c8;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar1 = (this->super_cmParseMumpsCoverage).Coverage;
  __position._M_node = (pcVar1->TotalCoverage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)__position._M_node !=
      &(pcVar1->TotalCoverage)._M_t._M_impl.super__Rb_tree_header) {
    do {
      if (*(_Base_ptr *)(__position._M_node + 2) == __position._M_node[2]._M_parent) {
LAB_0018242c:
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"No coverage found in: ",0x16);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,*(char **)(__position._M_node + 1),
                            (long)__position._M_node[1]._M_parent);
        std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        this_00 = (this->super_cmParseMumpsCoverage).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(this_00,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                     ,0x41,(char *)local_1c8,((this->super_cmParseMumpsCoverage).Coverage)->Quiet);
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        pcVar1 = (this->super_cmParseMumpsCoverage).Coverage;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ::_M_erase_aux(&(pcVar1->TotalCoverage)._M_t,__position);
      }
      else {
        bVar6 = true;
        p_Var2 = *(_Base_ptr *)(__position._M_node + 2);
        do {
          puVar5 = &p_Var2->field_0x4;
          if (0 < (int)p_Var2->_M_color) {
            bVar6 = false;
            break;
          }
          p_Var2 = (_Base_ptr)puVar5;
        } while ((_Base_ptr)puVar5 != __position._M_node[2]._M_parent);
        if (bVar6) goto LAB_0018242c;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
      __position._M_node = p_Var4;
    } while ((_Rb_tree_header *)p_Var4 !=
             &(((this->super_cmParseMumpsCoverage).Coverage)->TotalCoverage)._M_t._M_impl.
              super__Rb_tree_header);
  }
  return;
}

Assistant:

void cmParseCacheCoverage::RemoveUnCoveredFiles()
{
  // loop over the coverage data computed and remove all files
  // that only have -1 or 0 for the lines.
  cmCTestCoverageHandlerContainer::TotalCoverageMap::iterator ci =
    this->Coverage.TotalCoverage.begin();
  while (ci != this->Coverage.TotalCoverage.end()) {
    cmCTestCoverageHandlerContainer::SingleFileCoverageVector& v = ci->second;
    bool nothing = true;
    for (int i : v) {
      if (i > 0) {
        nothing = false;
        break;
      }
    }
    if (nothing) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "No coverage found in: " << ci->first << std::endl,
                         this->Coverage.Quiet);
      this->Coverage.TotalCoverage.erase(ci++);
    } else {
      ++ci;
    }
  }
}